

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateRoot(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  int iVar1;
  int iVar2;
  xmlNodePtr node;
  xmlChar *pxVar3;
  xmlChar fn [50];
  xmlChar local_68 [56];
  
  iVar2 = 0;
  if (doc != (xmlDocPtr)0x0) {
    node = xmlDocGetRootElement(doc);
    if ((node == (xmlNodePtr)0x0) || (node->name == (xmlChar *)0x0)) {
      iVar2 = 0;
      xmlErrValid(ctxt,XML_DTD_NO_ROOT,"no root element\n",(char *)0x0);
    }
    else {
      iVar2 = 1;
      if (((doc->intSubset != (_xmlDtd *)0x0) &&
          (pxVar3 = doc->intSubset->name, pxVar3 != (xmlChar *)0x0)) &&
         (iVar1 = xmlStrEqual(pxVar3,node->name), iVar1 == 0)) {
        if ((node->ns != (xmlNs *)0x0) && (pxVar3 = node->ns->prefix, pxVar3 != (xmlChar *)0x0)) {
          pxVar3 = xmlBuildQName(node->name,pxVar3,local_68,0x32);
          if (pxVar3 == (xmlChar *)0x0) {
            xmlVErrMemory(ctxt,(char *)0x0);
            return 0;
          }
          iVar2 = xmlStrEqual(doc->intSubset->name,pxVar3);
          if ((pxVar3 != local_68) && (pxVar3 != node->name)) {
            (*xmlFree)(pxVar3);
          }
          if (iVar2 == 1) {
            return 1;
          }
        }
        iVar2 = xmlStrEqual(doc->intSubset->name,(xmlChar *)"HTML");
        if ((iVar2 != 0) && (iVar2 = xmlStrEqual(node->name,"html"), iVar2 != 0)) {
          return 1;
        }
        xmlErrValidNode(ctxt,node,XML_DTD_ROOT_NAME,
                        "root and DTD name do not match \'%s\' and \'%s\'\n",node->name,
                        doc->intSubset->name,(xmlChar *)0x0);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlValidateRoot(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlNodePtr root;
    int ret;

    if (doc == NULL) return(0);

    root = xmlDocGetRootElement(doc);
    if ((root == NULL) || (root->name == NULL)) {
	xmlErrValid(ctxt, XML_DTD_NO_ROOT,
	            "no root element\n", NULL);
        return(0);
    }

    /*
     * When doing post validation against a separate DTD, those may
     * no internal subset has been generated
     */
    if ((doc->intSubset != NULL) &&
	(doc->intSubset->name != NULL)) {
	/*
	 * Check first the document root against the NQName
	 */
	if (!xmlStrEqual(doc->intSubset->name, root->name)) {
	    if ((root->ns != NULL) && (root->ns->prefix != NULL)) {
		xmlChar fn[50];
		xmlChar *fullname;

		fullname = xmlBuildQName(root->name, root->ns->prefix, fn, 50);
		if (fullname == NULL) {
		    xmlVErrMemory(ctxt, NULL);
		    return(0);
		}
		ret = xmlStrEqual(doc->intSubset->name, fullname);
		if ((fullname != fn) && (fullname != root->name))
		    xmlFree(fullname);
		if (ret == 1)
		    goto name_ok;
	    }
	    if ((xmlStrEqual(doc->intSubset->name, BAD_CAST "HTML")) &&
		(xmlStrEqual(root->name, BAD_CAST "html")))
		goto name_ok;
	    xmlErrValidNode(ctxt, root, XML_DTD_ROOT_NAME,
		   "root and DTD name do not match '%s' and '%s'\n",
		   root->name, doc->intSubset->name, NULL);
	    return(0);
	}
    }
name_ok:
    return(1);
}